

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)

{
  undefined4 uVar1;
  long *plVar2;
  undefined4 *puVar3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  byte *pbVar10;
  long lVar11;
  long in_RDI;
  bool bVar12;
  mz_uint32 t_2;
  mz_uint32 t_1;
  mz_uint64 root_1;
  mz_uint64 child_1;
  mz_uint32 t;
  mz_uint64 root;
  mz_uint64 child;
  mz_uint32 size;
  mz_uint32 end;
  mz_uint32 start;
  mz_uint32 *pIndices;
  mz_zip_array *pCentral_dir;
  mz_zip_array *pCentral_dir_offsets;
  mz_zip_internal_state *pState;
  mz_uint8 r_3;
  mz_uint8 l_3;
  mz_uint r_len_3;
  mz_uint l_len_3;
  mz_uint8 *pR_3;
  mz_uint8 *pE_3;
  mz_uint8 *pL_3;
  mz_uint8 r_2;
  mz_uint8 l_2;
  mz_uint r_len_2;
  mz_uint l_len_2;
  mz_uint8 *pR_2;
  mz_uint8 *pE_2;
  mz_uint8 *pL_2;
  mz_uint8 r_1;
  mz_uint8 l_1;
  mz_uint r_len_1;
  mz_uint l_len_1;
  mz_uint8 *pR_1;
  mz_uint8 *pE_1;
  mz_uint8 *pL_1;
  mz_uint8 r;
  mz_uint8 l;
  mz_uint r_len;
  mz_uint l_len;
  mz_uint8 *pR;
  mz_uint8 *pE;
  mz_uint8 *pL;
  uint local_3b4;
  uint local_364;
  bool local_322;
  uint local_314;
  uint local_2c4;
  bool local_281;
  long local_270;
  ulong local_258;
  uint local_240;
  uint local_23c;
  byte local_1fa;
  byte local_1f9;
  byte *local_1f0;
  byte *local_1e0;
  byte local_17a;
  byte local_179;
  byte *local_170;
  byte *local_160;
  byte local_fa;
  byte local_f9;
  byte *local_f0;
  byte *local_e0;
  byte local_7a;
  byte local_79;
  byte *local_70;
  byte *local_60;
  
  plVar2 = *(long **)(in_RDI + 0x68);
  plVar6 = plVar2 + 4;
  local_240 = *(uint *)(in_RDI + 0x10);
  if (local_240 < 2) {
    return;
  }
  puVar3 = (undefined4 *)plVar2[8];
  if (plVar2[9] == 0) {
    __assert_fail("index < pArray->m_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                  ,0x129b,"mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)");
  }
  local_23c = local_240 - 2 >> 1;
  do {
    local_258 = (ulong)local_23c;
    while( true ) {
      lVar7 = local_258 * 2;
      uVar8 = lVar7 + 1;
      if (local_240 <= uVar8) break;
      local_281 = false;
      if (lVar7 + 2U < (ulong)local_240) {
        if ((ulong)plVar2[5] <= (ulong)(uint)puVar3[uVar8]) {
          __assert_fail("index < pArray->m_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                        ,0x129b,"mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)");
        }
        uVar4 = *(uint *)(*plVar6 + (ulong)(uint)puVar3[uVar8] * 4);
        if ((ulong)plVar2[1] <= (ulong)uVar4) {
          __assert_fail("index < pArray->m_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                        ,0x129b,"mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)");
        }
        lVar9 = *plVar2 + (ulong)uVar4;
        if ((ulong)plVar2[5] <= (ulong)(uint)puVar3[lVar7 + 2]) {
          __assert_fail("index < pArray->m_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                        ,0x129b,"mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)");
        }
        uVar4 = *(uint *)(*plVar6 + (ulong)(uint)puVar3[lVar7 + 2] * 4);
        if ((ulong)plVar2[1] <= (ulong)uVar4) {
          __assert_fail("index < pArray->m_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                        ,0x129b,"mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)");
        }
        lVar7 = *plVar2 + (ulong)uVar4;
        uVar4 = (uint)*(ushort *)(lVar9 + 0x1c);
        uVar5 = (uint)*(ushort *)(lVar7 + 0x1c);
        local_79 = 0;
        local_7a = 0;
        local_60 = (byte *)(lVar9 + 0x2e);
        local_70 = (byte *)(lVar7 + 0x2e);
        local_2c4 = uVar5;
        if (uVar4 < uVar5) {
          local_2c4 = uVar4;
        }
        pbVar10 = local_60 + local_2c4;
        for (; local_60 < pbVar10; local_60 = local_60 + 1) {
          if ((*local_60 < 0x41) || (0x5a < *local_60)) {
            local_79 = *local_60;
          }
          else {
            local_79 = *local_60 + 0x20;
          }
          if ((*local_70 < 0x41) || (0x5a < *local_70)) {
            local_7a = *local_70;
          }
          else {
            local_7a = *local_70 + 0x20;
          }
          if (local_79 != local_7a) break;
          local_70 = local_70 + 1;
        }
        if (local_60 == pbVar10) {
          local_281 = uVar4 < uVar5;
        }
        else {
          local_281 = local_79 < local_7a;
        }
      }
      uVar8 = local_281 + uVar8;
      if ((ulong)plVar2[5] <= (ulong)(uint)puVar3[local_258]) {
        __assert_fail("index < pArray->m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                      ,0x129b,"mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)");
      }
      uVar4 = *(uint *)(*plVar6 + (ulong)(uint)puVar3[local_258] * 4);
      if ((ulong)plVar2[1] <= (ulong)uVar4) {
        __assert_fail("index < pArray->m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                      ,0x129b,"mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)");
      }
      lVar7 = *plVar2 + (ulong)uVar4;
      if ((ulong)plVar2[5] <= (ulong)(uint)puVar3[uVar8]) {
        __assert_fail("index < pArray->m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                      ,0x129b,"mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)");
      }
      uVar4 = *(uint *)(*plVar6 + (ulong)(uint)puVar3[uVar8] * 4);
      if ((ulong)plVar2[1] <= (ulong)uVar4) {
        __assert_fail("index < pArray->m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                      ,0x129b,"mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)");
      }
      lVar9 = *plVar2 + (ulong)uVar4;
      uVar4 = (uint)*(ushort *)(lVar7 + 0x1c);
      uVar5 = (uint)*(ushort *)(lVar9 + 0x1c);
      local_f9 = 0;
      local_fa = 0;
      local_e0 = (byte *)(lVar7 + 0x2e);
      local_f0 = (byte *)(lVar9 + 0x2e);
      local_314 = uVar5;
      if (uVar4 < uVar5) {
        local_314 = uVar4;
      }
      pbVar10 = local_e0 + local_314;
      for (; local_e0 < pbVar10; local_e0 = local_e0 + 1) {
        if ((*local_e0 < 0x41) || (0x5a < *local_e0)) {
          local_f9 = *local_e0;
        }
        else {
          local_f9 = *local_e0 + 0x20;
        }
        if ((*local_f0 < 0x41) || (0x5a < *local_f0)) {
          local_fa = *local_f0;
        }
        else {
          local_fa = *local_f0 + 0x20;
        }
        if (local_f9 != local_fa) break;
        local_f0 = local_f0 + 1;
      }
      if (local_e0 == pbVar10) {
        bVar12 = uVar4 < uVar5;
      }
      else {
        bVar12 = local_f9 < local_fa;
      }
      if (!bVar12) break;
      uVar1 = puVar3[local_258];
      puVar3[local_258] = puVar3[uVar8];
      puVar3[uVar8] = uVar1;
      local_258 = uVar8;
    }
    if (local_23c == 0) {
      do {
        local_240 = local_240 - 1;
        if (local_240 == 0) {
          return;
        }
        local_270 = 0;
        uVar1 = puVar3[local_240];
        puVar3[local_240] = *puVar3;
        *puVar3 = uVar1;
        while( true ) {
          lVar7 = local_270 * 2;
          uVar8 = lVar7 + 1;
          if (local_240 <= uVar8) break;
          local_322 = false;
          if (lVar7 + 2U < (ulong)local_240) {
            if ((ulong)plVar2[5] <= (ulong)(uint)puVar3[uVar8]) {
              __assert_fail("index < pArray->m_size",
                            "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                            ,0x129b,
                            "mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)");
            }
            uVar4 = *(uint *)(*plVar6 + (ulong)(uint)puVar3[uVar8] * 4);
            if ((ulong)plVar2[1] <= (ulong)uVar4) {
              __assert_fail("index < pArray->m_size",
                            "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                            ,0x129b,
                            "mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)");
            }
            lVar9 = *plVar2 + (ulong)uVar4;
            if ((ulong)plVar2[5] <= (ulong)(uint)puVar3[lVar7 + 2]) {
              __assert_fail("index < pArray->m_size",
                            "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                            ,0x129b,
                            "mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)");
            }
            uVar4 = *(uint *)(*plVar6 + (ulong)(uint)puVar3[lVar7 + 2] * 4);
            if ((ulong)plVar2[1] <= (ulong)uVar4) {
              __assert_fail("index < pArray->m_size",
                            "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                            ,0x129b,
                            "mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)");
            }
            lVar7 = *plVar2 + (ulong)uVar4;
            uVar4 = (uint)*(ushort *)(lVar9 + 0x1c);
            uVar5 = (uint)*(ushort *)(lVar7 + 0x1c);
            local_179 = 0;
            local_17a = 0;
            local_160 = (byte *)(lVar9 + 0x2e);
            local_170 = (byte *)(lVar7 + 0x2e);
            local_364 = uVar5;
            if (uVar4 < uVar5) {
              local_364 = uVar4;
            }
            pbVar10 = local_160 + local_364;
            for (; local_160 < pbVar10; local_160 = local_160 + 1) {
              if ((*local_160 < 0x41) || (0x5a < *local_160)) {
                local_179 = *local_160;
              }
              else {
                local_179 = *local_160 + 0x20;
              }
              if ((*local_170 < 0x41) || (0x5a < *local_170)) {
                local_17a = *local_170;
              }
              else {
                local_17a = *local_170 + 0x20;
              }
              if (local_179 != local_17a) break;
              local_170 = local_170 + 1;
            }
            if (local_160 == pbVar10) {
              local_322 = uVar4 < uVar5;
            }
            else {
              local_322 = local_179 < local_17a;
            }
          }
          lVar7 = local_322 + uVar8;
          if ((ulong)plVar2[5] <= (ulong)(uint)puVar3[local_270]) {
            __assert_fail("index < pArray->m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                          ,0x129b,"mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)")
            ;
          }
          uVar4 = *(uint *)(*plVar6 + (ulong)(uint)puVar3[local_270] * 4);
          if ((ulong)plVar2[1] <= (ulong)uVar4) {
            __assert_fail("index < pArray->m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                          ,0x129b,"mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)")
            ;
          }
          lVar9 = *plVar2 + (ulong)uVar4;
          if ((ulong)plVar2[5] <= (ulong)(uint)puVar3[lVar7]) {
            __assert_fail("index < pArray->m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                          ,0x129b,"mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)")
            ;
          }
          uVar4 = *(uint *)(*plVar6 + (ulong)(uint)puVar3[lVar7] * 4);
          if ((ulong)plVar2[1] <= (ulong)uVar4) {
            __assert_fail("index < pArray->m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                          ,0x129b,"mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)")
            ;
          }
          lVar11 = *plVar2 + (ulong)uVar4;
          uVar4 = (uint)*(ushort *)(lVar9 + 0x1c);
          uVar5 = (uint)*(ushort *)(lVar11 + 0x1c);
          local_1f9 = 0;
          local_1fa = 0;
          local_1e0 = (byte *)(lVar9 + 0x2e);
          local_1f0 = (byte *)(lVar11 + 0x2e);
          local_3b4 = uVar5;
          if (uVar4 < uVar5) {
            local_3b4 = uVar4;
          }
          pbVar10 = local_1e0 + local_3b4;
          for (; local_1e0 < pbVar10; local_1e0 = local_1e0 + 1) {
            if ((*local_1e0 < 0x41) || (0x5a < *local_1e0)) {
              local_1f9 = *local_1e0;
            }
            else {
              local_1f9 = *local_1e0 + 0x20;
            }
            if ((*local_1f0 < 0x41) || (0x5a < *local_1f0)) {
              local_1fa = *local_1f0;
            }
            else {
              local_1fa = *local_1f0 + 0x20;
            }
            if (local_1f9 != local_1fa) break;
            local_1f0 = local_1f0 + 1;
          }
          if (local_1e0 == pbVar10) {
            bVar12 = uVar4 < uVar5;
          }
          else {
            bVar12 = local_1f9 < local_1fa;
          }
          if (!bVar12) break;
          uVar1 = puVar3[local_270];
          puVar3[local_270] = puVar3[lVar7];
          puVar3[lVar7] = uVar1;
          local_270 = lVar7;
        }
      } while( true );
    }
    local_23c = local_23c - 1;
  } while( true );
}

Assistant:

static void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive* pZip) {

    mz_zip_internal_state* pState = pZip->m_pState;
    const mz_zip_array* pCentral_dir_offsets = &pState->m_central_dir_offsets;
    const mz_zip_array* pCentral_dir = &pState->m_central_dir;
    mz_uint32* pIndices;
    mz_uint32 start, end;
    const mz_uint32 size = pZip->m_total_files;

    if (size <= 1U)
        return;

    pIndices = &MZ_ZIP_ARRAY_ELEMENT(&pState->m_sorted_central_dir_offsets, mz_uint32, 0);

    start = (size - 2U) >> 1U;
    for (;;) {
        mz_uint64 child, root = start;
        for (;;) {
            if ((child = (root << 1U) + 1U) >= size)
                break;
            child += (((child + 1U) < size) && (mz_zip_reader_filename_less(pCentral_dir,
                                                                            pCentral_dir_offsets,
                                                                            pIndices[child],
                                                                            pIndices[child + 1U])));
            if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
                break;
            MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
            root = child;
        }
        if (!start)
            break;
        start--;
    }

    end = size - 1;
    while (end > 0) {
        mz_uint64 child, root = 0;
        MZ_SWAP_UINT32(pIndices[end], pIndices[0]);
        for (;;) {
            if ((child = (root << 1U) + 1U) >= end)
                break;
            child += (((child + 1U) < end) && mz_zip_reader_filename_less(pCentral_dir,
                                                                          pCentral_dir_offsets,
                                                                          pIndices[child],
                                                                          pIndices[child + 1U]));
            if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
                break;
            MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
            root = child;
        }
        end--;
    }
}